

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O1

OrphanBuilder *
capnp::_::OrphanBuilder::initData
          (OrphanBuilder *__return_storage_ptr__,BuilderArena *arena,CapTableBuilder *capTable,
          ByteCount size)

{
  undefined1 auVar1 [16];
  int iVar2;
  ulong uVar3;
  uint amount;
  AllocateResult AVar4;
  ThrowOverflow local_29;
  
  __return_storage_ptr__->capTable = (CapTableBuilder *)0x0;
  __return_storage_ptr__->location = (word *)0x0;
  (__return_storage_ptr__->tag).content = 0;
  __return_storage_ptr__->segment = (SegmentBuilder *)0x0;
  if (0x1fffffff < size) {
    kj::ThrowOverflow::operator()(&local_29);
  }
  amount = size + 7 >> 3;
  if (arena == (BuilderArena *)0x0) {
    if (*(int *)((long)&(__return_storage_ptr__->tag).content + 4) != 0 ||
        (int)(__return_storage_ptr__->tag).content != 0) {
      WireHelpers::zeroObject((SegmentBuilder *)0x0,capTable,(WirePointer *)__return_storage_ptr__);
    }
    if ((long)((_DAT_00000018 * 8 + _DAT_00000010) - _DAT_00000028) >> 3 < (long)(ulong)amount) {
      uVar3 = 0;
    }
    else {
      uVar3 = _DAT_00000028;
      _DAT_00000028 = _DAT_00000028 + (ulong)amount * 8;
    }
    iVar2 = ((uint)(uVar3 - (long)__return_storage_ptr__ >> 1) & 0xfffffffc) - 3;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar3;
    AVar4 = (AllocateResult)(auVar1 << 0x40);
  }
  else {
    AVar4 = BuilderArena::allocate(arena,amount);
    iVar2 = -3;
  }
  *(int *)&(__return_storage_ptr__->tag).content = iVar2;
  *(ByteCount *)((long)&(__return_storage_ptr__->tag).content + 4) = size * 8 + 2;
  __return_storage_ptr__->segment = AVar4.segment;
  __return_storage_ptr__->capTable = capTable;
  __return_storage_ptr__->location = AVar4.words;
  return __return_storage_ptr__;
}

Assistant:

OrphanBuilder OrphanBuilder::initData(
    BuilderArena* arena, CapTableBuilder* capTable, ByteCount size) {
  OrphanBuilder result;
  auto allocation = WireHelpers::initDataPointer(result.tagAsPtr(), nullptr, capTable,
      assertMaxBits<BLOB_SIZE_BITS>(size), arena);
  result.segment = allocation.segment;
  result.capTable = capTable;
  result.location = reinterpret_cast<word*>(allocation.value.begin());
  return result;
}